

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrismExtend.cpp
# Opt level: O2

int pztopology::Pr<pztopology::TPZPoint>::SideDimension(int side)

{
  uint uVar1;
  ostream *poVar2;
  
  if ((uint)side < 3) {
    uVar1 = (uint)(side == 2);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Pr<TFather>::SideDimension side ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,side);
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar1 = 0xffffffff;
  }
  return uVar1;
}

Assistant:

int Pr<TFather>::SideDimension(int side) {
		if(side<0 || side >= NSides) {
			PZError << "Pr<TFather>::SideDimension side " << side << endl;
			return -1;
		}
		int ftns = side/TFather::NSides;
		int fatherside = side%TFather::NSides;
		if(ftns < 2) return TFather::SideDimension(fatherside);
		return TFather::SideDimension(fatherside)+1;
	}